

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

void __thiscall VariationalBayesEstimatorOnLDA::updateQz(VariationalBayesEstimatorOnLDA *this)

{
  uint uVar1;
  pointer pvVar2;
  integral_constant<int,_53> *piVar3;
  pointer puVar4;
  integral_constant<int,_53> *t;
  integral_constant<int,_53> *t_00;
  integral_constant<int,_53> *t_01;
  integral_constant<int,_53> *extraout_RDX;
  integral_constant<int,_53> *piVar5;
  integral_constant<int,_53> *piVar6;
  integral_constant<int,_53> *piVar7;
  ulong uVar8;
  long lVar9;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  double dVar12;
  detail local_f0;
  detail local_ef;
  detail local_ee;
  detail local_ed;
  longdouble local_ec;
  longdouble local_e0;
  longdouble local_d0;
  longdouble local_c0;
  longdouble local_b0;
  integral_constant<int,_53> *local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if ((this->_docVoca->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (this->_docVoca->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    piVar6 = (integral_constant<int,_53> *)0x0;
    local_ec = (longdouble)1.79769313486232e+308;
    do {
      pvVar2 = (this->_docVoca->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar4 = pvVar2[(long)piVar6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_a0 = piVar6;
      if (*(pointer *)
           ((long)&pvVar2[(long)piVar6].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data + 8) != puVar4) {
        uVar8 = 0;
        piVar5 = piVar6;
        do {
          piVar3 = (integral_constant<int,_53> *)(ulong)this->_K;
          if (this->_K == 0) {
            local_98 = 0.0;
          }
          else {
            uVar1 = puVar4[uVar8];
            local_98 = 0.0;
            lVar9 = 0;
            piVar7 = (integral_constant<int,_53> *)0x0;
            do {
              local_38 = *(double *)
                          (*(long *)((long)&(((this->_nkv).
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data + lVar9) +
                          (ulong)uVar1 * 8) +
                         (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar1];
              local_d0 = (longdouble)
                         CONCAT28(local_d0._8_2_,
                                  *(double *)
                                   (*(long *)&(this->_ndk).
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(long)piVar6].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data + (long)piVar7 * 8) +
                                  (this->_alpha).super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(long)piVar7]);
              local_e0 = (longdouble)
                         CONCAT28(local_e0._8_2_,
                                  (this->_nk).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[(long)piVar7] +
                                  this->_betaSum);
              local_b0 = (longdouble)
                         CONCAT28(local_b0._8_2_,
                                  (this->_nd).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[(long)local_a0] +
                                  this->_alphaSum);
              piVar3 = local_a0;
              boost::math::detail::
              digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)0x0,&local_f0,(longdouble)local_38,piVar5,
                         (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                          *)local_a0);
              lVar10 = ABS(in_ST0);
              dVar12 = 0.0;
              lVar11 = in_ST3;
              if (local_ec < lVar10) {
                local_c0 = lVar10;
                boost::math::policies::detail::raise_error<std::overflow_error,double>
                          ("boost::math::digamma<%1%>(%1%)","numeric overflow");
                dVar12 = (double)in_ST0;
                lVar10 = local_c0;
                lVar11 = in_ST3;
                local_40 = dVar12;
              }
              local_48 = (double)in_ST0;
              if (lVar10 <= local_ec) {
                dVar12 = local_48;
              }
              in_ST3 = in_ST6;
              dVar12 = exp(dVar12);
              local_c0 = (longdouble)CONCAT28(local_c0._8_2_,dVar12);
              local_50 = local_d0._0_8_;
              boost::math::detail::
              digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)0x0,&local_ef,(longdouble)local_d0._0_8_,t,
                         (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                          *)piVar3);
              lVar10 = ABS(in_ST1);
              dVar12 = 0.0;
              in_ST0 = in_ST4;
              if (local_ec < lVar10) {
                local_d0 = lVar10;
                boost::math::policies::detail::raise_error<std::overflow_error,double>
                          ("boost::math::digamma<%1%>(%1%)","numeric overflow");
                dVar12 = (double)in_ST1;
                lVar10 = local_d0;
                in_ST0 = in_ST4;
                local_58 = dVar12;
              }
              local_60 = (double)in_ST1;
              if (lVar10 <= local_ec) {
                dVar12 = local_60;
              }
              in_ST4 = in_ST3;
              dVar12 = exp(dVar12);
              local_d0 = (longdouble)CONCAT28(local_d0._8_2_,dVar12);
              local_68 = local_e0._0_8_;
              boost::math::detail::
              digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)0x0,&local_ee,(longdouble)local_e0._0_8_,t_00,
                         (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                          *)piVar3);
              lVar10 = ABS(in_ST2);
              dVar12 = 0.0;
              in_ST1 = in_ST5;
              if (local_ec < lVar10) {
                local_e0 = lVar10;
                boost::math::policies::detail::raise_error<std::overflow_error,double>
                          ("boost::math::digamma<%1%>(%1%)","numeric overflow");
                dVar12 = (double)in_ST2;
                lVar10 = local_e0;
                in_ST1 = in_ST5;
                local_70 = dVar12;
              }
              local_78 = (double)in_ST2;
              if (lVar10 <= local_ec) {
                dVar12 = local_78;
              }
              in_ST5 = in_ST4;
              dVar12 = exp(dVar12);
              local_e0 = (longdouble)CONCAT28(local_e0._8_2_,dVar12);
              local_80 = local_b0._0_8_;
              boost::math::detail::
              digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((longdouble *)0x0,&local_ed,(longdouble)local_b0._0_8_,t_01,
                         (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                          *)piVar3);
              lVar10 = ABS(lVar11);
              dVar12 = 0.0;
              in_ST2 = in_ST6;
              if (local_ec < lVar10) {
                local_b0 = lVar10;
                boost::math::policies::detail::raise_error<std::overflow_error,double>
                          ("boost::math::digamma<%1%>(%1%)","numeric overflow");
                dVar12 = (double)lVar11;
                lVar10 = local_b0;
                in_ST2 = in_ST6;
                local_88 = dVar12;
              }
              local_90 = (double)lVar11;
              if (lVar10 <= local_ec) {
                dVar12 = local_90;
              }
              in_ST6 = in_ST5;
              dVar12 = exp(dVar12);
              dVar12 = (local_c0._0_8_ * local_d0._0_8_) / (local_e0._0_8_ * dVar12);
              local_98 = local_98 + dVar12;
              *(double *)
               (*(long *)(*(long *)&(this->_qz).
                                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)piVar6].
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data + uVar8 * 0x18) +
               (long)piVar7 * 8) = dVar12;
              piVar7 = piVar7 + 1;
              piVar3 = (integral_constant<int,_53> *)(ulong)this->_K;
              lVar9 = lVar9 + 0x18;
              piVar5 = extraout_RDX;
            } while (piVar7 < piVar3);
          }
          if ((int)piVar3 != 0) {
            lVar9 = *(long *)(*(long *)&(this->_qz).
                                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[(long)piVar6].
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data + uVar8 * 0x18);
            piVar5 = (integral_constant<int,_53> *)0x0;
            do {
              *(double *)(lVar9 + (long)piVar5 * 8) =
                   *(double *)(lVar9 + (long)piVar5 * 8) / local_98;
              piVar5 = piVar5 + 1;
            } while (piVar3 != piVar5);
          }
          uVar8 = uVar8 + 1;
          pvVar2 = (this->_docVoca->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar4 = pvVar2[(long)piVar6].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar2[(long)piVar6].
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data + 8) - (long)puVar4
                                >> 2));
      }
      piVar6 = local_a0 + 1;
      piVar5 = (integral_constant<int,_53> *)
               (((long)(this->_docVoca->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_docVoca->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    } while (piVar6 <= piVar5 && (long)piVar5 - (long)piVar6 != 0);
  }
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateQz(){//{{{
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            double Zq = 0;
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                double term1 = 0, term2 = 0, term3 = 0, term4 = 0;
                double xikv = _nkv[k][v] + _beta[v];
                double xidk = _ndk[d][k] + _alpha[k];
                double xik = _nk[k] + _betaSum;
                double xid = _nd[d] + _alphaSum;
                try{
                    term1 = exp(boost::math::digamma(xikv));
                }catch(...){
                    term1 = 0;
                }
                try{
                    term2 = exp(boost::math::digamma(xidk));
                }catch(...){
                    term2 = 0;
                }
                try{
                    term3 = exp(boost::math::digamma(xik));
                }catch(...){
                    term3 = 0;
                }
                try{
                    term4 = exp(boost::math::digamma(xid));
                }catch(...){
                    term4 = 0;
                }
                double constProbability = (term1 * term2) / (term3 * term4);
                Zq += constProbability;
                _qz[d][l][k] = constProbability;
            }
            for(int k=0; k<_K; k++){
                _qz[d][l][k] /= Zq;
            }
        }
    }
}